

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O3

void anon_unknown.dwarf_3c8e00::printSpeed
               (int ref_elapsed_time,int elapsed_time,int width,int height)

{
  ostream *poVar1;
  
  *(undefined8 *)(std::operator>> + *(long *)(std::cout + -0x18)) = 2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[          ] ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"x",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": C time = ",0xb);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ref_elapsed_time);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," us, SIMD time = ",0x11);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,elapsed_time);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," us",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (~",3);
  poVar1 = std::ostream::_M_insert<double>((double)ref_elapsed_time / (double)elapsed_time);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"x) ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

static void printSpeed(int ref_elapsed_time, int elapsed_time, int width,
                       int height) {
  std::cout.precision(2);
  std::cout << "[          ] " << width << "x" << height
            << ": C time = " << ref_elapsed_time
            << " us, SIMD time = " << elapsed_time << " us"
            << " (~" << ref_elapsed_time / (double)elapsed_time << "x) "
            << std::endl;
}